

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
::default_disp_impl_t
          (default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
           *this,outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
                 *event_queue,
          outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
          *activity_tracker)

{
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
  local_30;
  outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  local_28;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *local_20;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *activity_tracker_local;
  outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  *event_queue_local;
  default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
  *this_local;
  
  local_20 = activity_tracker;
  activity_tracker_local =
       (outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
        *)event_queue;
  event_queue_local =
       (outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
        *)this;
  outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>::
  outliving_reference_t(&local_28,event_queue);
  default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ::default_disp_impl_basis_t
            (&this->
              super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
             ,&local_28);
  (this->
  super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ).super_dispatcher_t._vptr_dispatcher_t = (_func_int **)&PTR__default_disp_impl_t_005c3148;
  outliving_mutable<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>>
            ((so_5 *)&local_30,this);
  disp_data_source_t::disp_data_source_t(&this->m_data_source,&local_30);
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
  outliving_reference_t(&this->m_activity_tracker,activity_tracker);
  return;
}

Assistant:

default_disp_impl_t(
			outliving_reference_t< EVENT_QUEUE_TYPE > event_queue,
			outliving_reference_t< ACTIVITY_TRACKER > activity_tracker )
			:	default_disp_impl_basis_t< EVENT_QUEUE_TYPE >( std::move(event_queue) )
			,	m_data_source( outliving_mutable( *this ) )
			,	m_activity_tracker( std::move(activity_tracker) )
			{}